

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xbox.cpp
# Opt level: O0

void rw::xbox::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *this;
  int iVar1;
  uint32 uVar2;
  int32 iVar3;
  int32 iVar4;
  uint val;
  uint8 *puVar5;
  uint8 *data;
  int local_38;
  int32 i;
  int32 totalSize;
  int32 numLevels;
  XboxRaster *ras;
  Raster *raster;
  int32 chunksize;
  Stream *stream_local;
  Texture *tex_local;
  
  uVar2 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar2 - 0xc);
  Stream::writeU32(stream,5);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  iVar1 = nativeRasterOffset;
  this = tex->raster;
  iVar3 = Raster::getNumLevels(this);
  Stream::writeI32(stream,this->format);
  Stream::writeI16(stream,(ushort)(*(byte *)((long)&this->height + (long)iVar1) & 1));
  Stream::writeI16(stream,(int16)*(undefined4 *)((long)&this->depth + (long)iVar1));
  Stream::writeU16(stream,(uint16)this->width);
  Stream::writeU16(stream,(uint16)this->height);
  Stream::writeU8(stream,(uint8)this->depth);
  Stream::writeU8(stream,(uint8)iVar3);
  Stream::writeU8(stream,(uint8)this->type);
  Stream::writeU8(stream,(uint8)*(undefined4 *)((long)&this->format + (long)iVar1));
  local_38 = 0;
  for (data._4_4_ = 0; data._4_4_ < iVar3; data._4_4_ = data._4_4_ + 1) {
    iVar4 = getLevelSize(tex->raster,data._4_4_);
    local_38 = iVar4 + local_38;
  }
  val = local_38 + 3U & 0xfffffffc;
  Stream::writeI32(stream,val);
  if ((this->format & 0x4000U) == 0) {
    if ((this->format & 0x2000U) != 0) {
      (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + (long)iVar1),0x400);
    }
  }
  else {
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + (long)iVar1),0x80);
  }
  puVar5 = Raster::lock(this,0,2);
  (*stream->_vptr_Stream[3])(stream,puVar5,(ulong)val);
  Raster::unlock(this,0);
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_XBOX);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	Raster *raster = tex->raster;
	XboxRaster *ras = GETXBOXRASTEREXT(raster);
	int32 numLevels = raster->getNumLevels();
	stream->writeI32(raster->format);
	stream->writeI16(ras->hasAlpha);
	stream->writeI16(ras->unknownFlag);
	stream->writeU16(raster->width);
	stream->writeU16(raster->height);
	stream->writeU8(raster->depth);
	stream->writeU8(numLevels);
	stream->writeU8(raster->type);
	stream->writeU8(ras->format);

	int32 totalSize = 0;
	for(int32 i = 0; i < numLevels; i++)
		totalSize += getLevelSize(tex->raster, i);
	totalSize = (totalSize+3)&~3;
	stream->writeI32(totalSize);

	if(raster->format & Raster::PAL4)
		stream->write8(ras->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->write8(ras->palette, 4*256);

	// exploit the fact that mipmaps are allocated consecutively
	uint8 *data = raster->lock(0, Raster::LOCKREAD);
	stream->write8(data, totalSize);
	raster->unlock(0);
}